

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_putbit.c
# Opt level: O0

MPP_RET vp8e_set_buffer(Vp8ePutBitBuf *bitbuf,RK_U8 *data,RK_S32 size)

{
  RK_S32 size_local;
  RK_U8 *data_local;
  Vp8ePutBitBuf *bitbuf_local;
  
  if (((bitbuf == (Vp8ePutBitBuf *)0x0) || (data == (RK_U8 *)0x0)) || (size < 1)) {
    bitbuf_local._4_4_ = MPP_NOK;
  }
  else {
    bitbuf->data = data;
    bitbuf->p_data = data;
    bitbuf->size = size;
    bitbuf->range = 0xff;
    bitbuf->bottom = 0;
    bitbuf->bits_left = 0x18;
    bitbuf->byte_cnt = 0;
    bitbuf_local._4_4_ = MPP_OK;
  }
  return bitbuf_local._4_4_;
}

Assistant:

MPP_RET vp8e_set_buffer(Vp8ePutBitBuf *bitbuf, RK_U8 *data, RK_S32 size)
{
    if ((bitbuf == NULL) || (data == NULL) || (size < 1))
        return MPP_NOK;

    bitbuf->data = data;
    bitbuf->p_data = data;
    bitbuf->size = size;

    bitbuf->range = 255;
    bitbuf->bottom = 0;
    bitbuf->bits_left = 24;

    bitbuf->byte_cnt = 0;

    return MPP_OK;
}